

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

String * __thiscall Process::readAllStdErr(String *__return_storage_ptr__,Process *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->mString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mString).field_2;
  (__return_storage_ptr__->mString)._M_string_length = 0;
  (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
  local_40 = (size_type *)(this->mStdErrBuffer).mString._M_dataplus._M_p;
  paVar1 = &(this->mStdErrBuffer).mString.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40 == paVar1) {
    local_30 = paVar1->_M_allocated_capacity;
    uStack_28 = *(undefined8 *)((long)&(this->mStdErrBuffer).mString.field_2 + 8);
    local_40 = &local_30;
  }
  else {
    local_30 = paVar1->_M_allocated_capacity;
  }
  local_38 = (this->mStdErrBuffer).mString._M_string_length;
  (this->mStdErrBuffer).mString._M_dataplus._M_p = (pointer)paVar1;
  (this->mStdErrBuffer).mString._M_string_length = 0;
  (this->mStdErrBuffer).mString.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&this->mStdErrBuffer,(string *)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40);
  }
  this->mStdErrIndex = 0;
  return __return_storage_ptr__;
}

Assistant:

String Process::readAllStdErr()
{
    String out;
    std::swap(mStdErrBuffer, out);
    mStdErrIndex = 0;
    return out;
}